

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImVec2 ImGui::GetMouseDragDelta(int button,float lock_threshold)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  
  if (lock_threshold < 0.0) {
    lock_threshold = (GImGui->IO).MouseDragThreshold;
  }
  IVar3.x = 0.0;
  IVar3.y = 0.0;
  if (((GImGui->IO).MouseDown[button] == true) &&
     (lock_threshold * lock_threshold <= (GImGui->IO).MouseDragMaxDistanceSqr[button])) {
    IVar1 = (GImGui->IO).MousePos;
    IVar2 = (GImGui->IO).MouseClickedPos[button];
    IVar3.x = IVar1.x - IVar2.x;
    IVar3.y = IVar1.y - IVar2.y;
  }
  return IVar3;
}

Assistant:

ImVec2 ImGui::GetMouseDragDelta(int button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    if (g.IO.MouseDown[button])
        if (g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold)
            return g.IO.MousePos - g.IO.MouseClickedPos[button];     // Assume we can only get active with left-mouse button (at the moment).
    return ImVec2(0.0f, 0.0f);
}